

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O3

Result_t *
Kumu::WriteBufferIntoFile(Result_t *__return_storage_ptr__,ByteString *Buffer,string *Filename)

{
  undefined1 *__return_storage_ptr___00;
  ui32_t write_count;
  FileWriter Writer;
  Result_t result;
  ui32_t local_134;
  FileWriter local_130;
  Result_t local_f8;
  Result_t local_90;
  
  local_134 = 0;
  FileWriter::FileWriter(&local_130);
  __return_storage_ptr___00 = (undefined1 *)&local_f8;
  FileWriter::OpenWrite((Result_t *)__return_storage_ptr___00,&local_130,Filename);
  if (-1 < local_f8.value) {
    if (Buffer->m_Data == (byte_t *)0x0) {
      __assert_fail("m_Data",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                    ,0x221,"const byte_t *Kumu::ByteString::RoData() const");
    }
    FileWriter::Write(&local_90,&local_130,Buffer->m_Data,Buffer->m_Length,&local_134);
    Result_t::operator=(&local_f8,&local_90);
    Result_t::~Result_t(&local_90);
    if ((-1 < local_f8.value) && (Buffer->m_Length != local_134)) {
      __return_storage_ptr___00 = RESULT_WRITEFAIL;
    }
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)__return_storage_ptr___00);
  Result_t::~Result_t(&local_f8);
  FileWriter::~FileWriter(&local_130);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::WriteBufferIntoFile(const Kumu::ByteString& Buffer, const std::string& Filename)
{
  ui32_t write_count = 0;
  FileWriter Writer;

  Result_t result = Writer.OpenWrite(Filename);

  if ( KM_SUCCESS(result) )
    result = Writer.Write(Buffer.RoData(), Buffer.Length(), &write_count);

  if ( KM_SUCCESS(result) && Buffer.Length() != write_count) 
    return RESULT_WRITEFAIL;

  return result;
}